

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void * __thiscall ncnn::PoolAllocator::fastMalloc(PoolAllocator *this,size_t size)

{
  bool bVar1;
  pointer ppVar2;
  void *pvVar3;
  ulong in_RSI;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_> *in_RDI
  ;
  void *ptr;
  void *ptr_1;
  size_t bs;
  iterator it;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff68;
  unsigned_long *in_stack_ffffffffffffff70;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *this_00;
  const_iterator in_stack_ffffffffffffff78;
  value_type *__x;
  _List_const_iterator<std::pair<unsigned_long,_void_*>_> local_40;
  void *local_38;
  ulong local_30;
  _Self local_28;
  _Self local_20;
  ulong local_18;
  
  local_18 = in_RSI;
  Mutex::lock((Mutex *)0x11651d);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
       begin(in_stack_ffffffffffffff68);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
      Mutex::unlock((Mutex *)0x116682);
      pvVar3 = ncnn::fastMalloc((size_t)in_stack_ffffffffffffff70);
      Mutex::lock((Mutex *)0x1166a2);
      std::make_pair<unsigned_long&,void*&>(in_stack_ffffffffffffff70,(void **)(in_RDI + 5));
      std::__cxx11::
      list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
      push_back(in_RDI,(value_type *)in_stack_ffffffffffffff78._M_node);
      Mutex::unlock((Mutex *)0x1166e7);
      return pvVar3;
    }
    ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                       ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x116565);
    local_30 = ppVar2->first;
    if ((local_18 <= local_30) &&
       (local_30 *
        (uint)in_RDI[3].
              super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
              ._M_impl._M_node._M_size >> 8 <= local_18)) break;
    std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator++(&local_20,0);
  }
  ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                     ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x1165ad);
  local_38 = ppVar2->second;
  this_00 = in_RDI + 4;
  std::_List_const_iterator<std::pair<unsigned_long,_void_*>_>::_List_const_iterator
            (&local_40,&local_20);
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::erase
            (this_00,in_stack_ffffffffffffff78);
  Mutex::unlock((Mutex *)0x1165f8);
  Mutex::lock((Mutex *)0x116606);
  __x = (value_type *)(in_RDI + 5);
  std::make_pair<unsigned_long&,void*&>((unsigned_long *)this_00,(void **)in_stack_ffffffffffffff68)
  ;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back(in_RDI,__x);
  Mutex::unlock((Mutex *)0x11664a);
  return local_38;
}

Assistant:

void* PoolAllocator::fastMalloc(size_t size)
{
    budgets_lock.lock();

    // find free budget
    std::list< std::pair<size_t, void*> >::iterator it = budgets.begin();
    for (; it != budgets.end(); it++)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            budgets.erase(it);

            budgets_lock.unlock();

            payouts_lock.lock();

            payouts.push_back(std::make_pair(bs, ptr));

            payouts_lock.unlock();

            return ptr;
        }
    }

    budgets_lock.unlock();

    // new
    void* ptr = ncnn::fastMalloc(size);

    payouts_lock.lock();

    payouts.push_back(std::make_pair(size, ptr));

    payouts_lock.unlock();

    return ptr;
}